

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

bool __thiscall
cmCTestLaunch::Match
          (cmCTestLaunch *this,string *line,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  bool bVar1;
  reference this_00;
  RegularExpression *r;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps_local;
  string *line_local;
  cmCTestLaunch *this_local;
  
  __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                     (regexps);
  r = (RegularExpression *)
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end(regexps)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                *)&r);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
              ::operator*(&__end1);
    bVar1 = cmsys::RegularExpression::find(this_00,line);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmCTestLaunch::Match(std::string const& line,
                          std::vector<cmsys::RegularExpression>& regexps)
{
  for (cmsys::RegularExpression& r : regexps) {
    if (r.find(line)) {
      return true;
    }
  }
  return false;
}